

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thdat06.c
# Opt level: O1

int th06_open(thdat_t *thdat,thtk_error_t **error)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ssize_t sVar5;
  off_t oVar6;
  thtk_io_t *output;
  uchar *puVar7;
  size_t sVar8;
  thdat_entry_t *ptVar9;
  size_t sVar10;
  thdat_entry_t *ptVar11;
  ulong uVar12;
  thdat_entry_t *ptVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  uchar *__src;
  uchar *map;
  char magic [4];
  th07_header_t header;
  int local_54;
  thtk_error_t **local_50;
  bitstream local_48;
  
  sVar5 = thtk_io_read(thdat->stream,&local_54,4,error);
  if (sVar5 != 4) {
    return 0;
  }
  local_50 = error;
  if (local_54 == 0x33474250) {
    bitstream_init(&local_48,thdat->stream);
    uVar2 = bitstream_read(&local_48,2);
    uVar2 = bitstream_read(&local_48,uVar2 * 8 + 8);
    uVar3 = bitstream_read(&local_48,2);
    uVar3 = bitstream_read(&local_48,uVar3 * 8 + 8);
    thdat->offset = uVar3;
    oVar6 = thtk_io_seek(thdat->stream,(ulong)uVar3,0,error);
    if (oVar6 == -1) {
      return 0;
    }
    bitstream_init(&local_48,thdat->stream);
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        sVar8 = thdat->entry_count + 1;
        thdat->entry_count = sVar8;
        ptVar9 = (thdat_entry_t *)realloc(thdat->entries,sVar8 * 0x120);
        thdat->entries = ptVar9;
        sVar8 = thdat->entry_count;
        thdat_entry_init(ptVar9 + (sVar8 - 1));
        uVar4 = bitstream_read(&local_48,2);
        bitstream_read(&local_48,uVar4 * 8 + 8);
        uVar4 = bitstream_read(&local_48,2);
        bitstream_read(&local_48,uVar4 * 8 + 8);
        uVar4 = bitstream_read(&local_48,2);
        uVar4 = bitstream_read(&local_48,uVar4 * 8 + 8);
        ptVar9[sVar8 - 1].extra = uVar4;
        uVar4 = bitstream_read(&local_48,2);
        uVar4 = bitstream_read(&local_48,uVar4 * 8 + 8);
        ptVar9[sVar8 - 1].offset = (ulong)uVar4;
        uVar4 = bitstream_read(&local_48,2);
        uVar4 = bitstream_read(&local_48,uVar4 * 8 + 8);
        ptVar9[sVar8 - 1].size = (ulong)uVar4;
        lVar15 = -0x120;
        do {
          uVar4 = bitstream_read(&local_48,8);
          ptVar9[sVar8].name[lVar15] = (char)uVar4;
          if ((char)uVar4 == '\0') break;
          iVar14 = (int)lVar15;
          lVar15 = lVar15 + 1;
        } while (iVar14 != -0x22);
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar2);
    }
  }
  else {
    if (local_54 != 0x34474250) {
      thtk_error_func_new(error,"th06_open","magic string not recognized");
      return 0;
    }
    sVar5 = thtk_io_read(thdat->stream,&local_48,0xc,error);
    if (sVar5 != 0xc) {
      return 0;
    }
    oVar6 = thtk_io_seek(thdat->stream,0,2,error);
    if (oVar6 == -1) {
      return 0;
    }
    oVar6 = thtk_io_seek(thdat->stream,(ulong)local_48.stream._4_4_,0,error);
    if (oVar6 == -1) {
      return 0;
    }
    output = thtk_io_open_growing_memory(error);
    sVar5 = th_unlzss(thdat->stream,output,(ulong)local_48.byte_count,error);
    if (sVar5 == -1) {
      return 0;
    }
    puVar7 = thtk_io_map(output,0,(ulong)local_48.byte_count,error);
    if (puVar7 == (uchar *)0x0) {
      return 0;
    }
    map = puVar7;
    if ((uint)local_48.stream != 0) {
      uVar16 = 0;
      __src = puVar7;
      do {
        sVar8 = thdat->entry_count + 1;
        thdat->entry_count = sVar8;
        ptVar9 = (thdat_entry_t *)realloc(thdat->entries,sVar8 * 0x120);
        thdat->entries = ptVar9;
        sVar8 = thdat->entry_count;
        ptVar13 = ptVar9 + (sVar8 - 1);
        thdat_entry_init(ptVar13);
        strcpy(ptVar13->name,(char *)__src);
        sVar10 = strlen(ptVar13->name);
        map = __src + sVar10 + 0xd;
        ptVar9[sVar8 - 1].offset = (ulong)*(uint *)(__src + sVar10 + 1);
        ptVar9[sVar8 - 1].size = (ulong)*(uint *)(__src + sVar10 + 5);
        ptVar9[sVar8 - 1].extra = *(uint32_t *)(__src + sVar10 + 9);
        uVar16 = uVar16 + 1;
        __src = map;
      } while (uVar16 < (uint)local_48.stream);
    }
    thtk_io_unmap(output,map);
    thtk_io_close(output);
    if (puVar7 == (uchar *)0x0) {
      return 0;
    }
  }
  iVar14 = 0;
  oVar6 = thtk_io_seek(thdat->stream,0,2,local_50);
  if (oVar6 != -1) {
    uVar1 = thdat->entry_count;
    if (uVar1 != 0) {
      ptVar9 = thdat->entries;
      uVar16 = 1;
      uVar12 = 0;
      ptVar13 = (thdat_entry_t *)0x0;
      do {
        ptVar11 = ptVar9 + uVar12;
        if (ptVar13 != (thdat_entry_t *)0x0) {
          ptVar13->zsize = ptVar11->offset - ptVar13->offset;
        }
        uVar12 = (ulong)uVar16;
        uVar16 = uVar16 + 1;
        ptVar13 = ptVar11;
      } while (uVar12 < uVar1);
      ptVar11->zsize = oVar6 - ptVar11->offset;
    }
    iVar14 = 1;
  }
  return iVar14;
}

Assistant:

static int
th06_open(
    thdat_t* thdat,
    thtk_error_t** error)
{
    char magic[4];

    if (thtk_io_read(thdat->stream, magic, 4, error) != 4)
        return 0;

    if (strncmp(magic, "PBG3", 4) == 0) {
        struct bitstream b;
        bitstream_init(&b, thdat->stream);
        uint32_t entry_count = th06_read_uint32(&b);
        thdat->offset = th06_read_uint32(&b);

        if (thtk_io_seek(thdat->stream, thdat->offset, SEEK_SET, error) == -1)
            return 0;

        bitstream_init(&b, thdat->stream);
        for (unsigned int i = 0; i < entry_count; ++i) {
            thdat_entry_t* entry;
            ARRAY_GROW(thdat->entry_count, thdat->entries, entry);
            thdat_entry_init(entry);
            th06_read_uint32(&b);
            th06_read_uint32(&b);
            entry->extra = th06_read_uint32(&b);
            entry->offset = th06_read_uint32(&b);
            entry->size = th06_read_uint32(&b);
            th06_read_string(&b, 255, entry->name);
        }
    } else if (strncmp(magic, "PBG4", 4) == 0) {
        th07_header_t header;

        if (thtk_io_read(thdat->stream, &header, sizeof(header), error) != sizeof(header))
            return 0;

        off_t end = thtk_io_seek(thdat->stream, 0, SEEK_END, error);
        if (end == -1)
            return 0;

        if (thtk_io_seek(thdat->stream, header.offset, SEEK_SET, error) == -1)
            return 0;

        thtk_io_t* entry_headers = thtk_io_open_growing_memory(error);
        /* XXX: I can't use header.size for this. */
        if (th_unlzss(thdat->stream, entry_headers, header.size, error) == -1)
            return 0;

        const uint32_t* ptr = (uint32_t*)thtk_io_map(entry_headers, 0, header.size, error);
        if (!ptr)
            return 0;
        for (unsigned int i = 0; i < header.count; ++i) {
            thdat_entry_t* entry = NULL;
            ARRAY_GROW(thdat->entry_count, thdat->entries, entry);
            thdat_entry_init(entry);
            strcpy(entry->name, (char*)ptr);
            ptr = (uint32_t*)((char*)ptr + strlen(entry->name) + 1);
            entry->offset = *ptr++;
            entry->size = *ptr++;
            entry->extra = *ptr++;
        }

        thtk_io_unmap(entry_headers, (unsigned char*)ptr);
        thtk_io_close(entry_headers);
    } else {
        thtk_error_new(error, "magic string not recognized");
        return 0;
    }

    off_t end_offset = thtk_io_seek(thdat->stream, 0, SEEK_END, error);
    if (end_offset == -1)
        return 0;

    if (thdat->entry_count) {
        thdat_entry_t* prev = NULL;
        for (unsigned int i = 0; i < thdat->entry_count; ++i) {
            thdat_entry_t* entry = &thdat->entries[i];
            if (prev)
                prev->zsize = entry->offset - prev->offset;
            prev = entry;
        }
        prev->zsize = end_offset - prev->offset;
    }

    return 1;
}